

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::IntStateScatterReactions
          (ChLinkPointTrifaceRot *this,uint off_L,ChVectorDynamic<> *L)

{
  long lVar1;
  double *pdVar2;
  
  lVar1 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)(ulong)off_L < lVar1) {
    pdVar2 = (L->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    (this->react).m_data[0] = pdVar2[off_L];
    if ((long)(ulong)(off_L + 1) < lVar1) {
      (this->react).m_data[1] = pdVar2[off_L + 1];
      if ((long)(ulong)(off_L + 2) < lVar1) {
        (this->react).m_data[2] = pdVar2[off_L + 2];
        return;
      }
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

void ChLinkPointTrifaceRot::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    react.x() = L(off_L + 0);
    react.y() = L(off_L + 1);
    react.z() = L(off_L + 2);
}